

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int GetScanDataResponseRPLIDAR
              (RPLIDAR *pRPLIDAR,double *pDistance,double *pAngle,BOOL *pbNewScan,int *pQuality)

{
  int iVar1;
  double dVar2;
  int local_4a4;
  undefined1 local_4a0 [8];
  CHRONO chrono;
  uchar *ptr;
  int local_448;
  int nbBytesDiscarded;
  int nbBytesToRequest;
  int res;
  int recvbuflen;
  int BytesReceived;
  uchar recvbuf [1024];
  int *pQuality_local;
  BOOL *pbNewScan_local;
  double *pAngle_local;
  double *pDistance_local;
  RPLIDAR *pRPLIDAR_local;
  
  res = 0;
  nbBytesToRequest = 0;
  nbBytesDiscarded = 1;
  local_448 = 0;
  ptr._4_4_ = 0;
  chrono.Suspended = 0;
  chrono._68_4_ = 0;
  recvbuf._1016_8_ = pQuality;
  StartChrono((CHRONO *)local_4a0);
  memset(&recvbuflen,0,0x400);
  nbBytesToRequest = 0x3ff;
  res = 0;
  local_448 = 5;
  iVar1 = ReadAllRS232Port(&pRPLIDAR->RS232Port,(uint8 *)&recvbuflen,5);
  if (iVar1 == 0) {
    res = local_448 + res;
    do {
      nbBytesDiscarded =
           FindScanDataResponseRPLIDAR
                     ((uchar *)&recvbuflen,res,pbNewScan,(int *)recvbuf._1016_8_,pAngle,pDistance,
                      &local_448,(uchar **)&chrono.Suspended,(int *)((long)&ptr + 4));
      if (nbBytesDiscarded == 0) {
        if (0 < (res - ptr._4_4_) + -5) {
          printf("Warning getting data from a RPLIDAR : Unexpected data after a data response. \n");
        }
        return 0;
      }
      if (nbBytesDiscarded == 1) {
        if (ptr._4_4_ < 6) {
          local_4a4 = ptr._4_4_;
        }
        else {
          local_4a4 = 5;
        }
        local_448 = local_4a4;
      }
      memmove(&recvbuflen,(void *)((long)&recvbuflen + (long)ptr._4_4_),(long)(res - ptr._4_4_));
      res = res - ptr._4_4_;
      if (nbBytesToRequest < res + local_448) {
        printf("Error reading data from a RPLIDAR : Invalid data. \n");
        return 4;
      }
      iVar1 = ReadAllRS232Port(&pRPLIDAR->RS232Port,(uint8 *)((long)&recvbuflen + (long)res),
                               local_448);
      if (iVar1 != 0) {
        printf("Error reading data from a RPLIDAR. \n");
        return 1;
      }
      res = local_448 + res;
      dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_4a0);
    } while (dVar2 <= 4.0);
    printf("Error reading data from a RPLIDAR : Data response timeout. \n");
    pRPLIDAR_local._4_4_ = 2;
  }
  else {
    printf("Error reading data from a RPLIDAR. \n");
    pRPLIDAR_local._4_4_ = 1;
  }
  return pRPLIDAR_local._4_4_;
}

Assistant:

inline int GetScanDataResponseRPLIDAR(RPLIDAR* pRPLIDAR, double* pDistance, double* pAngle, BOOL* pbNewScan, int* pQuality)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#if !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	sl_lidar_response_measurement_node_hq_t nodes[1+MAX_NB_MEASUREMENTS_PER_SCAN_RPLIDAR];
#else
	sl_lidar_response_measurement_node_hq_t nodes[1];
#endif // !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	size_t nodesCount = sizeof(nodes)/sizeof(sl_lidar_response_measurement_node_hq_t);
	size_t nodesRead = 0;
	int nbMeasurements = 1, j = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	if (!pRPLIDAR->nodes_cache->empty())
	{
		for (j = 0; j < min(nbMeasurements, (int)pRPLIDAR->nodes_cache->size()); j++)
		{
			nodes[j] = pRPLIDAR->nodes_cache->front();
			pRPLIDAR->nodes_cache->pop_front();
		}
		nodesRead = min(nbMeasurements, (int)pRPLIDAR->nodes_cache->size());
	}
	while ((int)nodesRead < nbMeasurements)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > pRPLIDAR->timeout)
		{
			printf("A RPLIDAR is not responding correctly : getScanDataWithIntervalHq() timeout. \n");
			return EXIT_TIMEOUT;
		}
		nodesCount = nbMeasurements-nodesRead;
		if (SL_IS_FAIL(pRPLIDAR->drv->getScanDataWithIntervalHq(nodes+nodesRead, nodesCount)))
		{
			uSleep(1000);
		}
		else nodesRead += nodesCount;
	}
	if ((int)nodesRead > nbMeasurements)
	{
		for (j = nbMeasurements; j < (int)nodesRead; j++)
		{
			pRPLIDAR->nodes_cache->push_back(nodes[j]);
		}
	}

	// Analyze the data response.
	*pbNewScan = (nodes[0].flag & SL_LIDAR_RESP_MEASUREMENT_SYNCBIT);
	*pQuality = (unsigned char)(nodes[0].quality);

	// Convert in rad.
	*pAngle = fmod_2PI_deg2rad(-nodes[0].angle_z_q14*90.0/(1 << 14));

	// Convert in m.
	*pDistance = nodes[0].dist_mm_q2/4000.0;
#else
	unsigned char recvbuf[MAX_NB_BYTES_RPLIDAR];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_RPLIDAR-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired data response...

	nbBytesToRequest = NB_BYTES_SCAN_DATA_RESPONSE_RPLIDAR;
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		res = FindScanDataResponseRPLIDAR(recvbuf, BytesReceived, pbNewScan, pQuality, pAngle, pDistance, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(NB_BYTES_SCAN_DATA_RESPONSE_RPLIDAR, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a RPLIDAR : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a RPLIDAR. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RPLIDAR)
		{
			printf("Error reading data from a RPLIDAR : Data response timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-NB_BYTES_SCAN_DATA_RESPONSE_RPLIDAR > 0)
	{
		printf("Warning getting data from a RPLIDAR : Unexpected data after a data response. \n");
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}